

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswBmc.c
# Opt level: O3

Aig_Obj_t * Ssw_BmcUnroll_rec(Ssw_Frm_t *pFrm,Aig_Obj_t *pObj,int f)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  Aig_Obj_t *p1;
  void **ppvVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  
  pAVar3 = Ssw_ObjFrame_((Ssw_Frm_t *)(ulong)(uint)pFrm->nObjs,(Aig_Obj_t *)pFrm->vAig2Frm,pObj->Id)
  ;
  if (pAVar3 != (Aig_Obj_t *)0x0) {
    return pAVar3;
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
  uVar6 = uVar2 & 7;
  if (uVar6 == 1) {
    pAVar3 = pFrm->pFrames->pConst1;
  }
  else if (uVar6 == 3) {
    Ssw_BmcUnroll_rec(pFrm,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f);
    uVar4 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
    if (uVar4 == 0) {
      pAVar3 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar3 = Ssw_ObjFrame_((Ssw_Frm_t *)(ulong)(uint)pFrm->nObjs,(Aig_Obj_t *)pFrm->vAig2Frm,
                             *(int *)(uVar4 + 0x24));
      pAVar3 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ (ulong)pAVar3);
    }
  }
  else if (uVar6 == 2) {
    if ((pObj->field_0).CioId < pFrm->pAig->nTruePis) {
      pAVar3 = Aig_ObjCreateCi(pFrm->pFrames);
    }
    else if (f == 0) {
      pAVar3 = (Aig_Obj_t *)((ulong)pFrm->pFrames->pConst1 ^ 1);
    }
    else {
      pAVar3 = Saig_ObjLoToLi(pFrm->pAig,pObj);
      pAVar3 = Ssw_BmcUnroll_rec(pFrm,pAVar3,f + -1);
    }
  }
  else {
    if ((uVar2 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswBmc.c"
                    ,0x44,"Aig_Obj_t *Ssw_BmcUnroll_rec(Ssw_Frm_t *, Aig_Obj_t *, int)");
    }
    Ssw_BmcUnroll_rec(pFrm,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f);
    Ssw_BmcUnroll_rec(pFrm,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),f);
    pAVar3 = Ssw_ObjChild0Fra_(pFrm,pObj,f);
    p1 = Ssw_ObjChild1Fra_(pFrm,pObj,f);
    pAVar3 = Aig_And(pFrm->pFrames,pAVar3,p1);
  }
  pVVar1 = pFrm->vAig2Frm;
  lVar7 = (long)f * (long)pFrm->nObjs;
  uVar4 = pObj->Id + lVar7;
  uVar2 = pVVar1->nSize;
  iVar8 = (int)uVar4;
  if (iVar8 < (int)uVar2) {
    uVar11 = (ulong)uVar2;
    goto LAB_005e0cf8;
  }
  uVar11 = pObj->Id + lVar7 + 1;
  iVar9 = pVVar1->nCap;
  iVar10 = (int)uVar11;
  if (iVar8 < iVar9 * 2) {
    if (iVar9 <= iVar8) {
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((long)iVar9 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar1->pArray,(long)iVar9 << 4);
      }
      pVVar1->pArray = ppvVar5;
      iVar9 = iVar9 * 2;
LAB_005e0cd0:
      pVVar1->nCap = iVar9;
      uVar2 = pVVar1->nSize;
    }
  }
  else if (iVar9 <= iVar8) {
    if (pVVar1->pArray == (void **)0x0) {
      ppvVar5 = (void **)malloc(uVar11 * 8);
    }
    else {
      ppvVar5 = (void **)realloc(pVVar1->pArray,uVar11 * 8);
    }
    pVVar1->pArray = ppvVar5;
    iVar9 = iVar10;
    goto LAB_005e0cd0;
  }
  if ((int)uVar2 <= iVar8) {
    lVar7 = (long)(int)uVar2;
    do {
      pVVar1->pArray[lVar7] = (void *)0x0;
      lVar7 = lVar7 + 1;
    } while (iVar10 != lVar7);
  }
  pVVar1->nSize = iVar10;
LAB_005e0cf8:
  if ((-1 < iVar8) && (iVar8 < (int)uVar11)) {
    pVVar1->pArray[uVar4 & 0xffffffff] = pAVar3;
    return pAVar3;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Incrementally unroll the timeframes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Obj_t * Ssw_BmcUnroll_rec( Ssw_Frm_t * pFrm, Aig_Obj_t * pObj, int f )
{
    Aig_Obj_t * pRes, * pRes0, * pRes1;
    if ( (pRes = Ssw_ObjFrame_(pFrm, pObj, f)) )
        return pRes;
    if ( Aig_ObjIsConst1(pObj) )
        pRes = Aig_ManConst1( pFrm->pFrames );
    else if ( Saig_ObjIsPi(pFrm->pAig, pObj) )
        pRes = Aig_ObjCreateCi( pFrm->pFrames );
    else if ( Aig_ObjIsCo(pObj) )
    {
        Ssw_BmcUnroll_rec( pFrm, Aig_ObjFanin0(pObj), f );
        pRes = Ssw_ObjChild0Fra_( pFrm, pObj, f );
    }
    else if ( Saig_ObjIsLo(pFrm->pAig, pObj) )
    {
        if ( f == 0 )
            pRes = Aig_ManConst0( pFrm->pFrames );
        else
            pRes = Ssw_BmcUnroll_rec( pFrm, Saig_ObjLoToLi(pFrm->pAig, pObj), f-1 );
    }
    else
    {
        assert( Aig_ObjIsNode(pObj) );
        Ssw_BmcUnroll_rec( pFrm, Aig_ObjFanin0(pObj), f );
        Ssw_BmcUnroll_rec( pFrm, Aig_ObjFanin1(pObj), f );
        pRes0 = Ssw_ObjChild0Fra_( pFrm, pObj, f );
        pRes1 = Ssw_ObjChild1Fra_( pFrm, pObj, f );
        pRes = Aig_And( pFrm->pFrames, pRes0, pRes1 );
    }
    Ssw_ObjSetFrame_( pFrm, pObj, f, pRes );
    return pRes;
}